

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

OStream * Json::operator<<(OStream *sout,Value *root)

{
  StreamWriter *__p;
  pointer pSVar1;
  unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_> local_50;
  StreamWriterPtr writer;
  StreamWriterBuilder builder;
  Value *root_local;
  OStream *sout_local;
  
  StreamWriterBuilder::StreamWriterBuilder((StreamWriterBuilder *)&writer);
  __p = StreamWriterBuilder::newStreamWriter((StreamWriterBuilder *)&writer);
  std::unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>>::
  unique_ptr<std::default_delete<Json::StreamWriter>,void>
            ((unique_ptr<Json::StreamWriter,std::default_delete<Json::StreamWriter>> *)&local_50,__p
            );
  pSVar1 = std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::operator->
                     (&local_50);
  (*pSVar1->_vptr_StreamWriter[2])(pSVar1,root,sout);
  std::unique_ptr<Json::StreamWriter,_std::default_delete<Json::StreamWriter>_>::~unique_ptr
            (&local_50);
  StreamWriterBuilder::~StreamWriterBuilder((StreamWriterBuilder *)&writer);
  return sout;
}

Assistant:

OStream& operator<<(OStream& sout, Value const& root) {
  StreamWriterBuilder builder;
  StreamWriterPtr const writer(builder.newStreamWriter());
  writer->write(root, &sout);
  return sout;
}